

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::NetStateRule::SharedCtor(NetStateRule *this)

{
  this->_cached_size_ = 0;
  this->phase_ = 0;
  this->min_level_ = 0;
  this->max_level_ = 0;
  return;
}

Assistant:

void NetStateRule::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&phase_, 0, reinterpret_cast<char*>(&max_level_) -
    reinterpret_cast<char*>(&phase_) + sizeof(max_level_));
}